

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cc
# Opt level: O0

void Minisat::limitTime(uint32_t max_cpu_time)

{
  int iVar1;
  undefined1 local_20 [8];
  rlimit rl;
  uint32_t max_cpu_time_local;
  
  if ((max_cpu_time != 0) &&
     ((rl.rlim_max._4_4_ = max_cpu_time, getrlimit(RLIMIT_CPU,(rlimit *)local_20),
      rl.rlim_cur == 0xffffffffffffffff || (rl.rlim_max._4_4_ < rl.rlim_cur)))) {
    local_20 = (undefined1  [8])(ulong)rl.rlim_max._4_4_;
    iVar1 = setrlimit(RLIMIT_CPU,(rlimit *)local_20);
    if (iVar1 == -1) {
      printf("WARNING! Could not set resource limit: CPU-time.\n");
    }
  }
  return;
}

Assistant:

void Minisat::limitTime(uint32_t max_cpu_time)
{
    if (max_cpu_time != 0){
        rlimit rl;
        getrlimit(RLIMIT_CPU, &rl);
        if (rl.rlim_max == RLIM_INFINITY || (rlim_t)max_cpu_time < rl.rlim_max){
            rl.rlim_cur = max_cpu_time;
            if (setrlimit(RLIMIT_CPU, &rl) == -1)
                printf("WARNING! Could not set resource limit: CPU-time.\n");
        }
    }
}